

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiPopupRef> *this;
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  value_type *ppIVar6;
  value_type *pvVar7;
  char *pcVar8;
  char *pcVar9;
  int i;
  uint i_00;
  int i_1;
  int i_01;
  char *pcVar10;
  
  bVar5 = Begin("ImGui Metrics",p_open,0);
  if (bVar5) {
    i_00 = 0;
    Text("ImGui %s","1.50 WIP");
    fVar1 = (GImGui->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar1),(double)fVar1);
    uVar2 = (GImGui->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(GImGui->IO).MetricsRenderVertices,
         (ulong)uVar2,(long)(int)uVar2 / 3 & 0xffffffff);
    Text("%d allocations",(ulong)(uint)(GImGui->IO).MetricsAllocs);
    Checkbox("Show clipping rectangles when hovering a ImDrawCmd",
             &ShowMetricsWindow::show_clip_rects);
    Separator();
    pIVar4 = GImGui;
    ShowMetricsWindow::Funcs::NodeWindows(&GImGui->Windows,"Windows");
    bVar5 = TreeNode("DrawList","Active DrawLists (%d)",(ulong)(uint)pIVar4->RenderDrawLists[0].Size
                    );
    if (bVar5) {
      for (; (int)i_00 < pIVar4->RenderDrawLists[0].Size; i_00 = i_00 + 1) {
        pcVar9 = (char *)(ulong)i_00;
        ppIVar6 = ImVector<ImDrawList_*>::operator[](pIVar4->RenderDrawLists,i_00);
        ShowMetricsWindow::Funcs::NodeDrawList(*ppIVar6,pcVar9);
      }
      TreePop();
    }
    bVar5 = TreeNode("Popups","Open Popups Stack (%d)",(ulong)(uint)(pIVar4->OpenPopupStack).Size);
    if (bVar5) {
      this = &pIVar4->OpenPopupStack;
      for (i_01 = 0; i_01 < this->Size; i_01 = i_01 + 1) {
        pvVar7 = ImVector<ImGuiPopupRef>::operator[](this,i_01);
        pIVar3 = pvVar7->Window;
        pvVar7 = ImVector<ImGuiPopupRef>::operator[](this,i_01);
        pcVar8 = "";
        pcVar9 = "NULL";
        pcVar10 = "";
        if (pIVar3 != (ImGuiWindow *)0x0) {
          pcVar9 = pIVar3->Name;
          pcVar8 = " ChildWindow";
          if (((uint)pIVar3->Flags >> 0x14 & 1) == 0) {
            pcVar8 = "";
          }
          pcVar10 = " ChildMenu";
          if (((uint)pIVar3->Flags >> 0x1b & 1) == 0) {
            pcVar10 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pvVar7->PopupId,pcVar9,pcVar8,pcVar10)
        ;
      }
      TreePop();
    }
    bVar5 = TreeNode("Basic state");
    if (bVar5) {
      pcVar8 = "NULL";
      pcVar9 = "NULL";
      if (pIVar4->FocusedWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar4->FocusedWindow->Name;
      }
      Text("FocusedWindow: \'%s\'",pcVar9);
      pcVar9 = "NULL";
      if (pIVar4->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar9 = pIVar4->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar9);
      if (pIVar4->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar8 = pIVar4->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar8);
      Text("HoveredID: 0x%08X/0x%08X",(ulong)pIVar4->HoveredId,(ulong)pIVar4->HoveredIdPreviousFrame
          );
      Text("ActiveID: 0x%08X/0x%08X",(ulong)pIVar4->ActiveId,(ulong)pIVar4->ActiveIdPreviousFrame);
      TreePop();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (ImGui::Begin("ImGui Metrics", p_open))
    {
        ImGui::Text("ImGui %s", ImGui::GetVersion());
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
        ImGui::Text("%d vertices, %d indices (%d triangles)", ImGui::GetIO().MetricsRenderVertices, ImGui::GetIO().MetricsRenderIndices, ImGui::GetIO().MetricsRenderIndices / 3);
        ImGui::Text("%d allocations", ImGui::GetIO().MetricsAllocs);
        static bool show_clip_rects = true;
        ImGui::Checkbox("Show clipping rectangles when hovering a ImDrawCmd", &show_clip_rects);
        ImGui::Separator();

        struct Funcs
        {
            static void NodeDrawList(ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }
                if (!node_open)
                    return;

                ImDrawList* overlay_draw_list = &GImGui->OverlayDrawList;   // Render additional visuals into the top-most draw list
                overlay_draw_list->PushClipRectFullScreen();
                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300], *buf_p = buf;
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += sprintf(buf_p, "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f, false);  // Add triangle without AA, more readable for large-thin triangle
                        }
                    ImGui::TreePop();
                }
                overlay_draw_list->PopClipRect();
                ImGui::TreePop();
            }

            static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
            {
                if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                    return;
                for (int i = 0; i < windows.Size; i++)
                    Funcs::NodeWindow(windows[i], "Window");
                ImGui::TreePop();
            }

            static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                NodeDrawList(window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f)", window->Pos.x, window->Pos.y);
                ImGui::BulletText("Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Scroll: (%.2f,%.2f)", window->Scroll.x, window->Scroll.y);
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }
        };

        ImGuiContext& g = *GImGui;                // Access private state
        Funcs::NodeWindows(g.Windows, "Windows");
        if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.RenderDrawLists[0].Size))
        {
            for (int i = 0; i < g.RenderDrawLists[0].Size; i++)
                Funcs::NodeDrawList(g.RenderDrawLists[0][i], "DrawList");
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("Popups", "Open Popups Stack (%d)", g.OpenPopupStack.Size))
        {
            for (int i = 0; i < g.OpenPopupStack.Size; i++)
            {
                ImGuiWindow* window = g.OpenPopupStack[i].Window;
                ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
            }
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("Basic state"))
        {
            ImGui::Text("FocusedWindow: '%s'", g.FocusedWindow ? g.FocusedWindow->Name : "NULL");
            ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
            ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
            ImGui::Text("HoveredID: 0x%08X/0x%08X", g.HoveredId, g.HoveredIdPreviousFrame); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
            ImGui::Text("ActiveID: 0x%08X/0x%08X", g.ActiveId, g.ActiveIdPreviousFrame);
            ImGui::TreePop();
        }
    }
    ImGui::End();
}